

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O0

void Gia_ManHighlight_rec(Gia_Man_t *p,int iObj)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pObj_00 = Gia_ManObj(p,iObj);
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
      Gia_ManHighlight_rec(p,iVar1);
    }
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninId1(pObj_00,iObj);
      Gia_ManHighlight_rec(p,iVar1);
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManHighlight_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManHighlight_rec( p, Gia_ObjFaninId0(pObj, iObj) );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManHighlight_rec( p, Gia_ObjFaninId1(pObj, iObj) );
}